

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

void __thiscall QPDFAcroFormDocumentHelper::analyze(QPDFAcroFormDocumentHelper *this)

{
  size_t *this_00;
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  mapped_type *this_01;
  vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>> *this_02;
  bool local_2fa;
  QPDFObjectHandle local_2e8;
  QPDFFormFieldObjectHelper local_2d8;
  allocator<char> local_299;
  string local_298;
  QPDFObjGen local_278;
  QPDFObjGen og;
  QPDFObjectHandle annot;
  QPDFAnnotationObjectHelper *iter;
  iterator __end2_1;
  iterator __begin2_1;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> local_210;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *local_1f8;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *__range2_1;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_1b8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_1a0;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  allocator<char> local_181;
  string local_180;
  QPDFObjectHandle local_160;
  QPDFObjectHandle local_150;
  reference local_140;
  QPDFObjectHandle *field;
  iterator __end2;
  iterator __begin2;
  Array *__range2;
  QPDFObjectHandle null;
  set visited;
  Array fa;
  string local_c0 [32];
  undefined1 local_a0 [8];
  QPDFObjectHandle fields;
  string local_88;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [24];
  QPDFObjectHandle acroform;
  QPDFAcroFormDocumentHelper *this_local;
  
  acroform.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar2 = std::
           __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  if ((peVar2->cache_valid & 1U) == 0) {
    peVar2 = std::
             __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    peVar2->cache_valid = true;
    QPDF::getRoot((QPDF *)local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"/AcroForm",&local_51);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_30 + 0x10),(string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_30);
    fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 0;
    fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._5_1_ = 0;
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)(local_30 + 0x10));
    local_2fa = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"/Fields",
                 (allocator<char> *)
                 ((long)&fields.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._5_1_ = 1;
      local_2fa = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_30 + 0x10),&local_88);
    }
    if ((fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&fields.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
    }
    if (((local_2fa ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"/Fields",
                 (allocator<char> *)
                 ((long)&fa.sp_elements._M_t.
                         super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                 + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_a0,(string *)(local_30 + 0x10));
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&fa.sp_elements._M_t.
                         super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
                         .
                         super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>
                 + 7));
      QPDFObjectHandle::as_array
                ((Array *)&visited.
                           super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (QPDFObjectHandle *)local_a0,strict);
      bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool
                        ((BaseHandle *)
                         &visited.
                          super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
                          _M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar1) {
        QPDFObjGen::set::set
                  ((set *)&null.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::newNull();
        this_00 = &visited.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_node_count;
        __end2 = ::qpdf::Array::begin((Array *)this_00);
        field = (QPDFObjectHandle *)::qpdf::Array::end((Array *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                           *)&field), bVar1) {
          local_140 = __gnu_cxx::
                      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                      ::operator*(&__end2);
          QPDFObjectHandle::QPDFObjectHandle(&local_150,local_140);
          QPDFObjectHandle::QPDFObjectHandle(&local_160,(QPDFObjectHandle *)&__range2);
          traverseField(this,&local_150,&local_160,0,
                        (set *)&null.super_BaseHandle.obj.
                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
          QPDFObjectHandle::~QPDFObjectHandle(&local_160);
          QPDFObjectHandle::~QPDFObjectHandle(&local_150);
          __gnu_cxx::
          __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
          ::operator++(&__end2);
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range2);
        QPDFObjGen::set::~set
                  ((set *)&null.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        QTC::TC("qpdf","QPDFAcroFormDocumentHelper fields not array",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,
                   "/Fields key of /AcroForm dictionary is not an array; ignoring",&local_181);
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)(local_30 + 0x10),&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        QPDFObjectHandle::newArray();
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_a0,(QPDFObjectHandle *)&__range1);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
      }
      ::qpdf::Array::~Array
                ((Array *)&visited.
                           super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      QPDFPageDocumentHelper::QPDFPageDocumentHelper
                ((QPDFPageDocumentHelper *)&__begin1,(this->super_QPDFDocumentHelper).qpdf);
      QPDFPageDocumentHelper::getAllPages(&local_1b8,(QPDFPageDocumentHelper *)&__begin1);
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
      local_1a0 = &local_1b8;
      __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin
                         (local_1a0);
      ph = (QPDFPageObjectHelper *)
           std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_1a0);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                         *)&ph), bVar1) {
        __range2_1 = (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                      *)__gnu_cxx::
                        __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                        ::operator*(&__end1);
        QPDFPageObjectHelper::QPDFPageObjectHelper
                  ((QPDFPageObjectHelper *)&__begin2_1,(QPDFPageObjectHelper *)__range2_1);
        getWidgetAnnotationsForPage(&local_210,this,(QPDFPageObjectHelper *)&__begin2_1);
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&__begin2_1);
        local_1f8 = &local_210;
        __end2_1 = std::
                   vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
                   begin(local_1f8);
        iter = (QPDFAnnotationObjectHelper *)
               std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
               ::end(local_1f8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
                                   *)&iter), bVar1) {
          __gnu_cxx::
          __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
          ::operator*(&__end2_1);
          QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&og);
          local_278 = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&og);
          peVar2 = std::
                   __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->m);
          sVar3 = std::
                  map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
                  ::count(&peVar2->annotation_to_field,&local_278);
          if (sVar3 == 0) {
            QTC::TC("qpdf","QPDFAcroFormDocumentHelper orphaned widget",0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_298,
                       "this widget annotation is not reachable from /AcroForm in the document catalog"
                       ,&local_299);
            QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&og,&local_298);
            std::__cxx11::string::~string((string *)&local_298);
            std::allocator<char>::~allocator(&local_299);
            QPDFObjectHandle::QPDFObjectHandle(&local_2e8,(QPDFObjectHandle *)&og);
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_2d8,&local_2e8);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            this_01 = std::
                      map<QPDFObjGen,_QPDFFormFieldObjectHelper,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
                      ::operator[](&peVar2->annotation_to_field,&local_278);
            QPDFFormFieldObjectHelper::operator=(this_01,&local_2d8);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_2d8);
            QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
            peVar2 = std::
                     __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->m);
            this_02 = (vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>
                       *)std::
                         map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
                         ::operator[](&peVar2->field_to_annotations,&local_278);
            std::vector<QPDFAnnotationObjectHelper,std::allocator<QPDFAnnotationObjectHelper>>::
            emplace_back<QPDFObjectHandle&>(this_02,(QPDFObjectHandle *)&og);
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&og);
          __gnu_cxx::
          __normal_iterator<QPDFAnnotationObjectHelper_*,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>
          ::operator++(&__end2_1);
        }
        fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ = 6;
        std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
        ~vector(&local_210);
        __gnu_cxx::
        __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
        ::operator++(&__end1);
      }
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 4;
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_1b8);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_a0);
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 0;
    }
    else {
      fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi._0_4_ = 1;
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_30 + 0x10));
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::analyze()
{
    if (m->cache_valid) {
        return;
    }
    m->cache_valid = true;
    QPDFObjectHandle acroform = qpdf.getRoot().getKey("/AcroForm");
    if (!(acroform.isDictionary() && acroform.hasKey("/Fields"))) {
        return;
    }
    QPDFObjectHandle fields = acroform.getKey("/Fields");
    if (auto fa = fields.as_array(strict)) {
        // Traverse /AcroForm to find annotations and map them bidirectionally to fields.

        QPDFObjGen::set visited;
        QPDFObjectHandle null(QPDFObjectHandle::newNull());
        for (auto const& field: fa) {
            traverseField(field, null, 0, visited);
        }
    } else {
        QTC::TC("qpdf", "QPDFAcroFormDocumentHelper fields not array");
        acroform.warnIfPossible("/Fields key of /AcroForm dictionary is not an array; ignoring");
        fields = QPDFObjectHandle::newArray();
    }

    // All Widget annotations should have been encountered by traversing /AcroForm, but in case any
    // weren't, find them by walking through pages, and treat any widget annotation that is not
    // associated with a field as its own field. This just ensures that requesting the field for any
    // annotation we find through a page's /Annots list will have some associated field. Note that
    // a file that contains this kind of error will probably not
    // actually work with most viewers.

    for (auto const& ph: QPDFPageDocumentHelper(qpdf).getAllPages()) {
        for (auto const& iter: getWidgetAnnotationsForPage(ph)) {
            QPDFObjectHandle annot(iter.getObjectHandle());
            QPDFObjGen og(annot.getObjGen());
            if (m->annotation_to_field.count(og) == 0) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper orphaned widget");
                // This is not supposed to happen, but it's easy enough for us to handle this case.
                // Treat the annotation as its own field. This could allow qpdf to sensibly handle a
                // case such as a PDF creator adding a self-contained annotation (merged with the
                // field dictionary) to the page's /Annots array and forgetting to also put it in
                // /AcroForm.
                annot.warnIfPossible(
                    "this widget annotation is not"
                    " reachable from /AcroForm in the document catalog");
                m->annotation_to_field[og] = QPDFFormFieldObjectHelper(annot);
                m->field_to_annotations[og].emplace_back(annot);
            }
        }
    }
}